

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmove_s.c
# Opt level: O3

int memmove_s(void *dst,size_t sizeInBytes,void *src,size_t count)

{
  int iVar1;
  void *pvVar2;
  
  if (count == 0) {
    return 0;
  }
  iVar1 = 0x16;
  if ((src != (void *)0x0 && dst != (void *)0x0) && (iVar1 = 0x22, count <= sizeInBytes)) {
    pvVar2 = memmove(dst,src,count);
    iVar1 = 0xc;
    if (pvVar2 != (void *)0x0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int __cdecl memmove_s(
    void * dst,
    size_t sizeInBytes,
    const void * src,
    size_t count
)
{
    if (count == 0)
    {
        /* nothing to do */
        return 0;
    }

    /* validation section */
    _VALIDATE_RETURN_ERRCODE(dst != NULL, EINVAL);
    _VALIDATE_RETURN_ERRCODE(src != NULL, EINVAL);
    _VALIDATE_RETURN_ERRCODE(sizeInBytes >= count, ERANGE);

    void *ret_val = memmove_xplat(dst, src, count);
    return ret_val != NULL ? 0 : ENOMEM; // memmove_xplat returns `NULL` only if ENOMEM
}